

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_resources_get_resource_list_for_type
          (spvc_resources resources,spvc_resource_type type,spvc_reflected_resource **resource_list,
          size_t *resource_size)

{
  long lVar1;
  spvc_context_s *this;
  spvc_result sVar2;
  uint uVar3;
  allocator local_31;
  string local_30;
  
  uVar3 = type - SPVC_RESOURCE_TYPE_UNIFORM_BUFFER;
  if ((uVar3 < 0xf) && ((0x6fffU >> (uVar3 & 0x1f) & 1) != 0)) {
    lVar1 = *(long *)(&DAT_00380860 + (ulong)uVar3 * 8);
    *resource_size =
         *(size_t *)((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x20);
    *resource_list =
         *(spvc_reflected_resource **)
          ((resources->uniform_buffers).stack_storage.aligned_char + lVar1 + -0x28);
    sVar2 = SPVC_SUCCESS;
  }
  else {
    this = resources->context;
    std::__cxx11::string::string((string *)&local_30,"Invalid argument.",&local_31);
    spvc_context_s::report_error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar2;
}

Assistant:

spvc_result spvc_resources_get_resource_list_for_type(spvc_resources resources, spvc_resource_type type,
                                                      const spvc_reflected_resource **resource_list,
                                                      size_t *resource_size)
{
	const SmallVector<spvc_reflected_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_RESOURCE_TYPE_UNIFORM_BUFFER:
		list = &resources->uniform_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_BUFFER:
		list = &resources->storage_buffers;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->stage_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->stage_outputs;
		break;

	case SPVC_RESOURCE_TYPE_SUBPASS_INPUT:
		list = &resources->subpass_inputs;
		break;

	case SPVC_RESOURCE_TYPE_STORAGE_IMAGE:
		list = &resources->storage_images;
		break;

	case SPVC_RESOURCE_TYPE_SAMPLED_IMAGE:
		list = &resources->sampled_images;
		break;

	case SPVC_RESOURCE_TYPE_ATOMIC_COUNTER:
		list = &resources->atomic_counters;
		break;

	case SPVC_RESOURCE_TYPE_PUSH_CONSTANT:
		list = &resources->push_constant_buffers;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_IMAGE:
		list = &resources->separate_images;
		break;

	case SPVC_RESOURCE_TYPE_SEPARATE_SAMPLERS:
		list = &resources->separate_samplers;
		break;

	case SPVC_RESOURCE_TYPE_ACCELERATION_STRUCTURE:
		list = &resources->acceleration_structures;
		break;

	case SPVC_RESOURCE_TYPE_SHADER_RECORD_BUFFER:
		list = &resources->shader_record_buffers;
		break;

	case SPVC_RESOURCE_TYPE_GL_PLAIN_UNIFORM:
		list = &resources->gl_plain_uniforms;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}